

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O2

void test_by_char<char,wchar_t>(locale *l,locale *lreal)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  _Alloc_hider _Var4;
  __type _Var5;
  bool bVar6;
  ostream *poVar7;
  money_put *pmVar8;
  money_get *pmVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  tm *ptVar11;
  time_put *ptVar12;
  runtime_error *prVar13;
  iostate err;
  uint uStack_454;
  size_type sStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  undefined8 local_438;
  long lStack_430;
  char *local_428;
  time_t a_datetime;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> rfmt;
  double n;
  locale local_3c8 [8];
  locale local_3c0 [8];
  locale local_3b8 [8];
  locale local_3b0 [8];
  locale local_3a8 [8];
  locale local_3a0 [8];
  locale local_398 [8];
  locale local_390 [8];
  locale local_388 [8];
  locale local_380 [8];
  ss_ref_type ss_ref;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  byte abStack_358 [8];
  uint auStack_350 [52];
  long alStack_280 [19];
  longdouble local_1e4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1d8;
  ss_type ss;
  long local_1a8 [2];
  byte abStack_198 [8];
  uint auStack_190 [48];
  long alStack_d0 [20];
  
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::posix");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::imbue(local_380);
  std::locale::~locale(local_380);
  std::ostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x48);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>((double *)&ss);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x4b);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((n != 1045.45) || (NAN(n))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x4c);
    poVar7 = std::operator<<(poVar7," n == 1045.45");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&rfmt,"1045.45",(allocator *)&local_1d8);
  std::locale::locale(local_3c8,l);
  to_correct_string<char>((string *)&err,(string *)&rfmt,local_3c8);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &ss_ref,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&err);
  std::__cxx11::string::~string((string *)&err);
  std::locale::~locale(local_3c8);
  std::__cxx11::string::~string((string *)&rfmt);
  std::__cxx11::string::~string((string *)&ss_ref);
  if (!_Var5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x4d);
    poVar7 = std::operator<<(poVar7," ss.str()==to_correct_string<CharType>(\"1045.45\",l)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::number");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::imbue(local_388);
  std::locale::~locale(local_388);
  booster::locale::as::number
            ((ios_base *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  std::ostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5a);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>((double *)&ss);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5d);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((n != 1045.45) || (NAN(n))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x5e);
    poVar7 = std::operator<<(poVar7," n == 1045.45");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&ss_ref);
  std::wios::imbue(local_390);
  std::locale::~locale(local_390);
  std::wostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar6 = equal<char,wchar_t>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &err,&rfmt);
  std::__cxx11::wstring::~wstring((wstring *)&rfmt);
  std::__cxx11::string::~string((string *)&err);
  if (!bVar6) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x65);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&err,"Error limits reached, stopping unit test",(allocator *)&rfmt);
      booster::runtime_error::runtime_error(prVar13,(string *)&err);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&ss_ref);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::currency national ");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&ss);
  std::wios::imbue(local_398);
  std::locale::~locale(local_398);
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x200;
  pmVar8 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (lreal);
  lVar3 = *(long *)((long)alStack_d0 + *(long *)(local_1a8[0] + -0x18) + 0x10);
  local_1e4 = (longdouble)104334.0;
  (**(code **)(*(long *)pmVar8 + 0x10))
            (pmVar8,lVar3,lVar3 == 0,0,(stringstream *)&ss + *(long *)(_ss + -0x18),0x20,
             SUB108(local_1e4,0),(short)((unkuint10)local_1e4 >> 0x40));
  _err = (pointer)((ulong)uStack_454 << 0x20);
  pmVar9 = std::
           use_facet<std::__cxx11::money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (lreal);
  (**(code **)(*(long *)pmVar9 + 0x10))
            (pmVar9,*(undefined8 *)((long)alStack_d0 + *(long *)(_ss + -0x18)),0xffffffffffffffff,0,
             0xffffffff,0,&ss + *(long *)(_ss + -0x18),(short)(string *)&err,
             (wstringstream *)&ss_ref);
  _Var4._M_p = _err;
  if (((ulong)_err & 4) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "-- Looks like standard library does not support parsing well");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss_ref);
  std::ios::imbue(local_3a0);
  std::locale::~locale(local_3a0);
  booster::locale::as::currency
            ((ios_base *)((long)&local_368 + *(long *)(local_368._M_allocated_capacity - 0x18)));
  std::ostream::_M_insert<double>(1043.34);
  if (((ulong)_Var4._M_p & 4) == 0) {
    test_counter = test_counter + 1;
    if ((abStack_358[*(long *)(_ss_ref + -0x18)] & 5) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x85);
      poVar7 = std::operator<<(poVar7," ss");
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar1 = error_counter + 1;
      bVar6 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar6) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&err,"Error limits reached, stopping unit test",(allocator *)&rfmt);
        booster::runtime_error::runtime_error(prVar13,(string *)&err);
        __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::istream::_M_extract<double>((double *)&ss_ref);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar6 = equal<char,wchar_t>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &err,&rfmt);
  std::__cxx11::wstring::~wstring((wstring *)&rfmt);
  std::__cxx11::string::~string((string *)&err);
  if (!bVar6) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8b);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&err,"Error limits reached, stopping unit test",(allocator *)&rfmt);
      booster::runtime_error::runtime_error(prVar13,(string *)&err);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss_ref);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&ss);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::currency iso");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::imbue(local_3a8);
  std::locale::~locale(local_3a8);
  booster::locale::as::currency
            ((ios_base *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  booster::locale::as::currency_iso
            ((ios_base *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  std::ostream::_M_insert<double>(1043.34);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x9a);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>((double *)&ss);
  test_counter = test_counter + 1;
  if ((abStack_198[*(long *)(_ss + -0x18)] & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x9d);
    poVar7 = std::operator<<(poVar7," ss");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((n != 1043.34) || (NAN(n))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x9e);
    poVar7 = std::operator<<(poVar7," v1==1043.34");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss_ref,"Error limits reached, stopping unit test",(allocator *)&err);
      booster::runtime_error::runtime_error(prVar13,(string *)&ss_ref);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&ss_ref);
  std::wios::imbue(local_3b0);
  std::locale::~locale(local_3b0);
  puVar2 = (uint *)((long)auStack_350 + *(long *)(local_368._M_allocated_capacity - 0x18));
  *puVar2 = *puVar2 | 0x200;
  pmVar8 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (lreal);
  lVar3 = *(long *)((long)alStack_280 + *(long *)(local_368._M_allocated_capacity - 0x18));
  (**(code **)(*(long *)pmVar8 + 0x10))
            (pmVar8,lVar3,lVar3 == 0,1,(wstringstream *)&ss_ref + *(long *)(_ss_ref + -0x18),0x20,
             SUB108(local_1e4,0),(short)((unkuint10)local_1e4 >> 0x40));
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar6 = equal<char,wchar_t>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &err,&rfmt);
  std::__cxx11::wstring::~wstring((wstring *)&rfmt);
  std::__cxx11::string::~string((string *)&err);
  if (!bVar6) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa5);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&err,"Error limits reached, stopping unit test",(allocator *)&rfmt);
      booster::runtime_error::runtime_error(prVar13,(string *)&err);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&ss_ref);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::date/time");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::imbue(local_3b8);
  std::locale::~locale(local_3b8);
  a_datetime = 0x2eff39;
  booster::locale::as::time_zone((set_timezone *)&ss_ref,"GMT");
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,(set_timezone *)&ss_ref);
  std::__cxx11::string::~string((string *)&ss_ref);
  booster::locale::as::date
            ((ios_base *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  poVar7 = std::ostream::_M_insert<long>((long)local_1a8);
  std::operator<<(poVar7,'\n');
  booster::locale::as::time
            ((time_t *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  poVar7 = std::ostream::_M_insert<long>((long)local_1a8);
  std::operator<<(poVar7,'\n');
  booster::locale::as::datetime
            ((ios_base *)
             ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8 +
             *(long *)(local_1a8[0] + -0x18)));
  poVar7 = std::ostream::_M_insert<long>((long)local_1a8);
  std::operator<<(poVar7,'\n');
  booster::locale::as::time_zone((set_timezone *)&ss_ref,"GMT+01:00");
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,(set_timezone *)&ss_ref);
  std::__cxx11::string::~string((string *)&ss_ref);
  conv_to_char<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,"%H")
  ;
  booster::locale::as::ftime<char>
            ((add_ftime<char> *)&ss_ref,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err);
  pbVar10 = booster::locale::as::details::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                       (add_ftime<char> *)&ss_ref);
  poVar7 = std::ostream::_M_insert<long>((long)pbVar10);
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::~string((string *)&ss_ref);
  std::__cxx11::string::~string((string *)&err);
  booster::locale::as::time_zone((set_timezone *)&ss_ref,"GMT+00:15");
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,(set_timezone *)&ss_ref);
  std::__cxx11::string::~string((string *)&ss_ref);
  conv_to_char<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,"%M")
  ;
  booster::locale::as::ftime<char>
            ((add_ftime<char> *)&ss_ref,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err);
  pbVar10 = booster::locale::as::details::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                       (add_ftime<char> *)&ss_ref);
  poVar7 = std::ostream::_M_insert<long>((long)pbVar10);
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::~string((string *)&ss_ref);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&ss_ref);
  std::wios::imbue(local_3c0);
  std::locale::~locale(local_3c0);
  conv_to_char<wchar_t>(&rfmt,"%x\n%X\n%c\n16\n48\n");
  ptVar11 = gmtime(&a_datetime);
  _err = *(pointer *)ptVar11;
  sStack_450._0_4_ = ptVar11->tm_hour;
  sStack_450._4_4_ = ptVar11->tm_mday;
  local_448._0_4_ = ptVar11->tm_mon;
  local_448._4_4_ = ptVar11->tm_year;
  local_448._8_4_ = ptVar11->tm_wday;
  local_448._12_4_ = ptVar11->tm_yday;
  local_438 = *(undefined8 *)&ptVar11->tm_isdst;
  lStack_430 = ptVar11->tm_gmtoff;
  local_428 = ptVar11->tm_zone;
  ptVar12 = std::
            use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                      (lreal);
  lVar3 = *(long *)((long)alStack_280 + *(long *)(local_368._M_allocated_capacity - 0x18));
  std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
            (ptVar12,lVar3,lVar3 == 0,(wstringstream *)&ss_ref + *(long *)(_ss_ref + -0x18),0x20,
             &err,rfmt._M_dataplus._M_p,
             (short)rfmt._M_dataplus._M_p + (short)rfmt._M_string_length * 4);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar6 = equal<char,wchar_t>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &n,&local_1d8);
  std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
  std::__cxx11::string::~string((string *)&n);
  if (!bVar6) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xca);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar1 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar6) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&n,"Error limits reached, stopping unit test",(allocator *)&local_1d8);
      booster::runtime_error::runtime_error(prVar13,(string *)&n);
      __cxa_throw(prVar13,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstring::~wstring((wstring *)&rfmt);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)&ss_ref);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void test_by_char(std::locale const &l,std::locale const &lreal)
{
    typedef std::basic_stringstream<CharType> ss_type;
    typedef std::basic_stringstream<RefCharType> ss_ref_type;

    using namespace booster::locale;

    {
        std::cout << "- Testing as::posix" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);
        TEST(ss.str()==to_correct_string<CharType>("1045.45",l));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::number" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::number;
        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        ss_ref << 1045.45;

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::currency national " << std::endl;

        bool bad_parsing = false;
        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,false,ss_ref,RefCharType(' '),104334);
        { // workaround MSVC library issues
            std::ios_base::iostate err=std::ios_base::iostate();
            typename std::money_get<RefCharType>::iter_type end;
            long double tmp;
            std::use_facet<std::money_get<RefCharType> >(lreal).get(ss_ref,end,false,ss_ref,err,tmp);
            if(err & std::ios_base::failbit) {
                std::cout << "-- Looks like standard library does not support parsing well" << std::endl;
                bad_parsing=true;
            }
        }

        ss_type ss;
        ss.imbue(l);

        ss << as::currency;
        ss << 1043.34;
        if(!bad_parsing) {
            TEST(ss);
            double v1;
            ss >> v1;
        }


        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif

    }

    {
        std::cout << "- Testing as::currency iso" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::currency << as::currency_iso;
        ss << 1043.34;
        TEST(ss);
        double v1;
        ss >> v1;
        TEST(ss);
        TEST(v1==1043.34);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,true,ss_ref,RefCharType(' '),104334);

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }
    
    
    {
        std::cout << "- Testing as::date/time" << std::endl;
        ss_type ss;
        ss.imbue(l);
        
        time_t a_date = 3600*24*(31+4); // Feb 5th
        time_t a_time = 3600*15+60*33; // 15:33:05
        time_t a_timesec = 13;
        time_t a_datetime = a_date + a_time + a_timesec;

        ss << as::time_zone("GMT");

        ss << as::date << a_datetime << CharType('\n');
        ss << as::time << a_datetime << CharType('\n');
        ss << as::datetime << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+01:00");
        ss << as::ftime(conv_to_char<CharType>("%H")) << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+00:15");
        ss << as::ftime(conv_to_char<CharType>("%M")) << a_datetime << CharType('\n');

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        std::basic_string<RefCharType> rfmt(conv_to_char<RefCharType>("%x\n%X\n%c\n16\n48\n"));

        std::tm tm=*gmtime(&a_datetime);

        std::use_facet<std::time_put<RefCharType> >(lreal).put(ss_ref,ss_ref,RefCharType(' '),&tm,rfmt.c_str(),rfmt.c_str()+rfmt.size());

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

}